

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

vm_obj_id_t CVmObjBigNum::create_radix(int in_root_set,char *str,size_t len,int radix)

{
  int iVar1;
  vm_obj_id_t obj_id;
  CVmObjBigNum *this;
  
  iVar1 = precision_from_string(str,len,radix);
  obj_id = vm_new_id(in_root_set,0,0);
  this = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
  if (radix == 10) {
    CVmObjBigNum(this,str,len,(long)iVar1);
  }
  else {
    CVmObjBigNum(this,(long)iVar1);
    set_str_val((CVmObjBigNum *)(G_obj_table_X.pages_[obj_id >> 0xc] + (obj_id & 0xfff)),str,len,
                radix);
  }
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjBigNum::create_radix(
    VMG_ int in_root_set, const char *str, size_t len, int radix)
{
    int digits = precision_from_string(str, len, radix);
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    if (radix == 10)
        new (vmg_ id) CVmObjBigNum(vmg_ str, len, digits);
    else
    {
        new (vmg_ id) CVmObjBigNum(vmg_ digits);
        ((CVmObjBigNum *)vm_objp(vmg_ id))->set_str_val(str, len, radix);
    }
    return id;
}